

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

void __thiscall
MeteomaticsApiClient::MeteomaticsApiClient
          (MeteomaticsApiClient *this,string *user,string *password,int timeout_seconds)

{
  HttpClient *this_00;
  allocator local_49;
  string local_48 [36];
  int local_24;
  string *psStack_20;
  int timeout_seconds_local;
  string *password_local;
  string *user_local;
  MeteomaticsApiClient *this_local;
  
  local_24 = timeout_seconds;
  psStack_20 = password;
  password_local = user;
  user_local = (string *)this;
  this_00 = (HttpClient *)operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"api.meteomatics.com",&local_49);
  MMIntern::HttpClient::HttpClient(this_00,(string *)local_48,password_local,psStack_20);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this->httpClient = this_00;
  this->dataRequestTimeout = local_24;
  return;
}

Assistant:

MeteomaticsApiClient::MeteomaticsApiClient(const std::string& user, const std::string& password, const int timeout_seconds)
: httpClient(new MMIntern::HttpClient("api.meteomatics.com", user, password))
, dataRequestTimeout(timeout_seconds)
{
}